

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.c
# Opt level: O1

int UUID_generate(UUID_T *uuid)

{
  UNIQUEID_RESULT UVar1;
  int iVar2;
  char *pcVar3;
  LOGGER_LOG p_Var4;
  int iVar5;
  char *pcVar6;
  
  if (uuid == (UUID_T *)0x0) {
    p_Var4 = xlogging_get_log_function();
    iVar2 = 0x9e;
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return 0x9e;
    }
    pcVar3 = "Invalid argument (uuid is NULL)";
    iVar5 = 0x9d;
LAB_0013130a:
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uuid.c"
              ,"UUID_generate",iVar5,1,pcVar3);
    return iVar2;
  }
  pcVar3 = (char *)malloc(0x25);
  if (pcVar3 == (char *)0x0) {
    p_Var4 = xlogging_get_log_function();
    iVar2 = 0xa9;
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return 0xa9;
    }
    pcVar3 = "Failed allocating UUID string, size=%zu";
    iVar5 = 0xa8;
    goto LAB_0013130a;
  }
  pcVar3[0x10] = '\0';
  pcVar3[0x11] = '\0';
  pcVar3[0x12] = '\0';
  pcVar3[0x13] = '\0';
  pcVar3[0x14] = '\0';
  pcVar3[0x15] = '\0';
  pcVar3[0x16] = '\0';
  pcVar3[0x17] = '\0';
  pcVar3[0x18] = '\0';
  pcVar3[0x19] = '\0';
  pcVar3[0x1a] = '\0';
  pcVar3[0x1b] = '\0';
  pcVar3[0x1c] = '\0';
  pcVar3[0x1d] = '\0';
  pcVar3[0x1e] = '\0';
  pcVar3[0x1f] = '\0';
  pcVar3[0] = '\0';
  pcVar3[1] = '\0';
  pcVar3[2] = '\0';
  pcVar3[3] = '\0';
  pcVar3[4] = '\0';
  pcVar3[5] = '\0';
  pcVar3[6] = '\0';
  pcVar3[7] = '\0';
  pcVar3[8] = '\0';
  pcVar3[9] = '\0';
  pcVar3[10] = '\0';
  pcVar3[0xb] = '\0';
  pcVar3[0xc] = '\0';
  pcVar3[0xd] = '\0';
  pcVar3[0xe] = '\0';
  pcVar3[0xf] = '\0';
  pcVar3[0x1d] = '\0';
  pcVar3[0x1e] = '\0';
  pcVar3[0x1f] = '\0';
  pcVar3[0x20] = '\0';
  pcVar3[0x21] = '\0';
  pcVar3[0x22] = '\0';
  pcVar3[0x23] = '\0';
  pcVar3[0x24] = '\0';
  UVar1 = UniqueId_Generate(pcVar3,0x25);
  if (UVar1 == UNIQUEID_OK) {
    iVar2 = UUID_from_string(pcVar3,uuid);
    if (iVar2 == 0) {
      iVar2 = 0;
      goto LAB_00131354;
    }
    p_Var4 = xlogging_get_log_function();
    iVar2 = 0xbb;
    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00131354;
    pcVar6 = "Failed parsing UUID string";
    iVar5 = 0xba;
  }
  else {
    p_Var4 = xlogging_get_log_function();
    iVar2 = 0xb4;
    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00131354;
    pcVar6 = "Failed generating UUID";
    iVar5 = 0xb3;
  }
  (*p_Var4)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uuid.c"
            ,"UUID_generate",iVar5,1,pcVar6);
LAB_00131354:
  free(pcVar3);
  return iVar2;
}

Assistant:

int UUID_generate(UUID_T* uuid)
{
    int result;

    // Codes_SRS_UUID_09_001: [ If uuid is NULL, UUID_generate shall return a non-zero value ]
    if (uuid == NULL)
    {
        LogError("Invalid argument (uuid is NULL)");
        result = MU_FAILURE;
    }
    else
    {
        char* uuid_string;
        size_t malloc_size;
        if ((malloc_size = safe_multiply_size_t(sizeof(char), UUID_STRING_SIZE)) == SIZE_MAX || 
            (uuid_string = (char*)malloc(malloc_size)) == NULL)
        {
            // Codes_SRS_UUID_09_003: [ If the UUID string fails to be obtained, UUID_generate shall fail and return a non-zero value ]
            LogError("Failed allocating UUID string, size=%zu", malloc_size);
            result = MU_FAILURE;
        }
        else
        {
            (void)memset(uuid_string, 0, sizeof(char) * UUID_STRING_SIZE);

            // Codes_SRS_UUID_09_002: [ UUID_generate shall obtain an UUID string from UniqueId_Generate ]
            if (UniqueId_Generate(uuid_string, UUID_STRING_SIZE) != UNIQUEID_OK)
            {
                // Codes_SRS_UUID_09_003: [ If the UUID string fails to be obtained, UUID_generate shall fail and return a non-zero value ]
                LogError("Failed generating UUID");
                result = MU_FAILURE;
            }
            // Codes_SRS_UUID_09_004: [ The UUID string shall be parsed into an UUID_T type (16 unsigned char array) and filled in uuid ]
            else if (UUID_from_string(uuid_string, uuid) != 0)
            {
                // Codes_SRS_UUID_09_005: [ If uuid fails to be set, UUID_generate shall fail and return a non-zero value ]
                LogError("Failed parsing UUID string");
                result = MU_FAILURE;
            }
            else
            {
                // Codes_SRS_UUID_09_006: [ If no failures occur, UUID_generate shall return zero ]
                result = __SUCCESS__;
            }

            free(uuid_string);
        }
    }

    return result;
}